

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParseFieldValueFromString
          (Parser *this,string *input,FieldDescriptor *field,Message *output)

{
  bool bVar1;
  int size;
  void *data;
  Descriptor *root_message_type;
  undefined1 local_140 [8];
  ParserImpl parser;
  ArrayInputStream input_stream;
  Message *output_local;
  FieldDescriptor *field_local;
  string *input_local;
  Parser *this_local;
  
  data = (void *)std::__cxx11::string::data();
  size = std::__cxx11::string::size();
  io::ArrayInputStream::ArrayInputStream
            ((ArrayInputStream *)&parser.singular_overwrite_policy_,data,size,-1);
  root_message_type = Message::GetDescriptor(output);
  ParserImpl::ParserImpl
            ((ParserImpl *)local_140,root_message_type,
             (ZeroCopyInputStream *)&parser.singular_overwrite_policy_,this->error_collector_,
             this->finder_,this->parse_info_tree_,ALLOW_SINGULAR_OVERWRITES,
             (bool)(this->allow_unknown_field_ & 1));
  bVar1 = ParserImpl::ParseField((ParserImpl *)local_140,field,output);
  ParserImpl::~ParserImpl((ParserImpl *)local_140);
  io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&parser.singular_overwrite_policy_);
  return bVar1;
}

Assistant:

bool TextFormat::Parser::ParseFieldValueFromString(
    const string& input,
    const FieldDescriptor* field,
    Message* output) {
  io::ArrayInputStream input_stream(input.data(), input.size());
  ParserImpl parser(output->GetDescriptor(), &input_stream, error_collector_,
                    finder_, parse_info_tree_,
                    ParserImpl::ALLOW_SINGULAR_OVERWRITES,
                    allow_unknown_field_);
  return parser.ParseField(field, output);
}